

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  void *pvVar1;
  long lVar2;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  initializer_list<std::pair<BigNum,_BigNum>_> __l;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_00;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_01;
  initializer_list<std::pair<BigNum,_BigNum>_> __l_02;
  BigNum b;
  BigNum c;
  BigNum a;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test2;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test1;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test4;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> test;
  long alStack_a80 [7];
  allocator_type local_a41;
  pair<BigNum,_BigNum> local_a40;
  pair<BigNum,_BigNum> local_a00;
  pair<BigNum,_BigNum> local_9c0;
  BigNum local_980;
  BigNum local_960;
  BigNum local_940;
  BigNum local_920;
  BigNum local_900;
  BigNum local_8e0;
  BigNum local_8c0;
  BigNum local_8a0;
  BigNum local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_6c0;
  BigNum local_6a8;
  BigNum local_688;
  BigNum local_668;
  BigNum local_648;
  BigNum local_628;
  BigNum local_608;
  BigNum local_5e8;
  BigNum local_5c8;
  BigNum local_5a8;
  BigNum local_588;
  BigNum local_568;
  BigNum local_548;
  BigNum local_528;
  BigNum local_508;
  BigNum local_4e8;
  BigNum local_4c8;
  BigNum local_4a8;
  BigNum local_488;
  BigNum local_468;
  BigNum local_448;
  BigNum local_428;
  BigNum local_408;
  BigNum local_3e8;
  BigNum local_3c8;
  BigNum local_3a8;
  BigNum local_388;
  BigNum local_368;
  BigNum local_348;
  BigNum local_328;
  BigNum local_308;
  BigNum local_2e8;
  BigNum local_2c8;
  BigNum local_2a8;
  BigNum local_288;
  BigNum local_268;
  BigNum local_248;
  BigNum local_228;
  BigNum local_208;
  BigNum local_1e8;
  BigNum local_1c8;
  BigNum local_1a8;
  BigNum local_188;
  BigNum local_168;
  BigNum local_148;
  BigNum local_128;
  BigNum local_108;
  BigNum local_e8;
  string local_c8;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_a8;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_90;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_78;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_60;
  vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> local_48;
  
  alStack_a80[6] = 0x108bb0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"6","");
  alStack_a80[6] = 0x108bc0;
  BigNum::BigNum(&local_940,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    alStack_a80[6] = 0x108bdd;
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x108c04;
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"2","");
  alStack_a80[6] = 0x108c19;
  BigNum::BigNum(&local_980,&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    alStack_a80[6] = 0x108c36;
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x108c5d;
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_700,"1234567827483828383893828238989938389893389","");
  alStack_a80[6] = 0x108c72;
  BigNum::BigNum(&local_960,&local_700);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    alStack_a80[6] = 0x108c8f;
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x108cb6;
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"123456798960569059","");
  alStack_a80[6] = 0x108cc8;
  BigNum::BigNum(&local_a40.first,&local_720);
  alStack_a80[6] = 0x108cda;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108d07;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    alStack_a80[6] = 0x108d24;
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x108d39;
  BigNum::BigNum(&local_e8,&local_980);
  alStack_a80[6] = 0x108d4b;
  sqrt(__x);
  alStack_a80[6] = 0x108d60;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108d8d;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108daa;
    operator_delete(local_e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x108dc2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," sqrt ",6);
  alStack_a80[6] = 0x108dd7;
  BigNum::BigNum(&local_108,&local_980);
  alStack_a80[6] = 0x108de4;
  print(&local_108);
  if (local_108.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108e01;
    operator_delete(local_108.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x108e1c;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x108e31;
  BigNum::BigNum(&local_128,&local_960);
  alStack_a80[6] = 0x108e3e;
  print(&local_128);
  if (local_128.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108e5b;
    operator_delete(local_128.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x108e6f;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x108e7e;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x108e86;
  std::ostream::flush();
  alStack_a80[6] = 0x108e98;
  BigNum::BigNum(&local_8c0,2);
  alStack_a80[6] = 0x108eaa;
  BigNum::BigNum(&local_8e0,5);
  alStack_a80[6] = 0x108ec7;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a40,&local_8c0,&local_8e0);
  alStack_a80[6] = 0x108ede;
  BigNum::BigNum(&local_900,3);
  alStack_a80[6] = 0x108ef0;
  BigNum::BigNum(&local_920,7);
  alStack_a80[6] = 0x108f08;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a00,&local_900,&local_920);
  alStack_a80[6] = 0x108f22;
  BigNum::BigNum(&local_880,5);
  alStack_a80[6] = 0x108f34;
  BigNum::BigNum(&local_8a0,0xb);
  alStack_a80[6] = 0x108f4c;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_9c0,&local_880,&local_8a0);
  alStack_a80[6] = 0x108f6b;
  __l._M_len = 3;
  __l._M_array = &local_a40;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_48,__l,(allocator_type *)&local_6c0);
  lVar2 = 0xc0;
  do {
    pvVar1 = *(void **)((long)alStack_a80 + lVar2 + 0x20);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x108f97;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x30) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_a80 + lVar2);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x108fae;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  if (local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108fd1;
    operator_delete(local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x108fee;
    operator_delete(local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10900b;
    operator_delete(local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109028;
    operator_delete(local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109045;
    operator_delete(local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109062;
    operator_delete(local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109077;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_60,&local_48);
  alStack_a80[6] = 0x109089;
  solve_system(&local_a40.first,&local_60);
  alStack_a80[6] = 0x10909e;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1090c6;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1090d3;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_60);
  alStack_a80[6] = 0x1090ee;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result: ",8);
  alStack_a80[6] = 0x109103;
  BigNum::BigNum(&local_148,&local_960);
  alStack_a80[6] = 0x109110;
  print(&local_148);
  if (local_148.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10912d;
    operator_delete(local_148.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109141;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x109150;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109158;
  std::ostream::flush();
  alStack_a80[6] = 0x10916a;
  BigNum::BigNum(&local_8c0,5);
  alStack_a80[6] = 0x10917c;
  BigNum::BigNum(&local_8e0,9);
  alStack_a80[6] = 0x109199;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a40,&local_8c0,&local_8e0);
  alStack_a80[6] = 0x1091b0;
  BigNum::BigNum(&local_900,7);
  alStack_a80[6] = 0x1091c2;
  BigNum::BigNum(&local_920,8);
  alStack_a80[6] = 0x1091da;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a00,&local_900,&local_920);
  alStack_a80[6] = 0x1091f4;
  BigNum::BigNum(&local_880,3);
  alStack_a80[6] = 0x109206;
  BigNum::BigNum(&local_8a0,7);
  alStack_a80[6] = 0x10921e;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_9c0,&local_880,&local_8a0);
  alStack_a80[6] = 0x10923a;
  __l_00._M_len = 3;
  __l_00._M_array = &local_a40;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_6c0,__l_00,&local_a41);
  lVar2 = 0xc0;
  do {
    pvVar1 = *(void **)((long)alStack_a80 + lVar2 + 0x20);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x109256;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x30) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_a80 + lVar2);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x10926d;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  if (local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109290;
    operator_delete(local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8a0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1092ad;
    operator_delete(local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_880.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1092ca;
    operator_delete(local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1092e7;
    operator_delete(local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109304;
    operator_delete(local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109321;
    operator_delete(local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109336;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_78,&local_6c0);
  alStack_a80[6] = 0x109348;
  solve_system(&local_a40.first,&local_78);
  alStack_a80[6] = 0x10935d;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109385;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109392;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_78);
  alStack_a80[6] = 0x1093ad;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result: ",8);
  alStack_a80[6] = 0x1093c2;
  BigNum::BigNum(&local_168,&local_960);
  alStack_a80[6] = 0x1093cf;
  print(&local_168);
  if (local_168.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1093ec;
    operator_delete(local_168.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109400;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10940f;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109417;
  std::ostream::flush();
  alStack_a80[6] = 0x109429;
  BigNum::BigNum(&local_8c0,1);
  alStack_a80[6] = 0x10943b;
  BigNum::BigNum(&local_8e0,5);
  alStack_a80[6] = 0x109458;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a40,&local_8c0,&local_8e0);
  alStack_a80[6] = 0x10946f;
  BigNum::BigNum(&local_900,2);
  alStack_a80[6] = 0x109481;
  BigNum::BigNum(&local_920,7);
  alStack_a80[6] = 0x109499;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a00,&local_900,&local_920);
  alStack_a80[6] = 0x1094b8;
  __l_01._M_len = 2;
  __l_01._M_array = &local_a40;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_880,__l_01,(allocator_type *)&local_8a0);
  lVar2 = 0x80;
  do {
    pvVar1 = *(void **)((long)alStack_a80 + lVar2 + 0x20);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x1094d4;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x30) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_a80 + lVar2);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x1094eb;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  if (local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10950e;
    operator_delete(local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10952b;
    operator_delete(local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109548;
    operator_delete(local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109565;
    operator_delete(local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10957a;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_90,
             (vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_880);
  alStack_a80[6] = 0x10958c;
  solve_system(&local_a40.first,&local_90);
  alStack_a80[6] = 0x1095a1;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1095c9;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1095d6;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_90);
  alStack_a80[6] = 0x1095f1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result: ",8);
  alStack_a80[6] = 0x109606;
  BigNum::BigNum(&local_188,&local_960);
  alStack_a80[6] = 0x109613;
  print(&local_188);
  if (local_188.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109630;
    operator_delete(local_188.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109644;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x109653;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10965b;
  std::ostream::flush();
  alStack_a80[6] = 0x10966a;
  BigNum::BigNum(&local_8c0,0);
  alStack_a80[6] = 0x10967c;
  BigNum::BigNum(&local_8e0,2);
  alStack_a80[6] = 0x109699;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a40,&local_8c0,&local_8e0);
  alStack_a80[6] = 0x1096ad;
  BigNum::BigNum(&local_900,0);
  alStack_a80[6] = 0x1096bf;
  BigNum::BigNum(&local_920,4);
  alStack_a80[6] = 0x1096d7;
  std::pair<BigNum,_BigNum>::pair<BigNum,_BigNum,_true>(&local_a00,&local_900,&local_920);
  alStack_a80[6] = 0x1096f3;
  __l_02._M_len = 2;
  __l_02._M_array = &local_a40;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_8a0,__l_02,&local_a41);
  lVar2 = 0x80;
  do {
    pvVar1 = *(void **)((long)alStack_a80 + lVar2 + 0x20);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x10970f;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x30) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_a80 + lVar2);
    if (pvVar1 != (void *)0x0) {
      alStack_a80[6] = 0x109726;
      operator_delete(pvVar1,*(long *)((long)alStack_a80 + lVar2 + 0x10) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  if (local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109749;
    operator_delete(local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_920.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109766;
    operator_delete(local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_900.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109783;
    operator_delete(local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8e0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1097a0;
    operator_delete(local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1097b5;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::vector
            (&local_a8,
             (vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_8a0);
  alStack_a80[6] = 0x1097c7;
  solve_system(&local_a40.first,&local_a8);
  alStack_a80[6] = 0x1097d9;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109801;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10980e;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_a8);
  alStack_a80[6] = 0x109829;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Result: ",8);
  alStack_a80[6] = 0x10983e;
  BigNum::BigNum(&local_1a8,&local_960);
  alStack_a80[6] = 0x10984b;
  print(&local_1a8);
  if (local_1a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109868;
    operator_delete(local_1a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10987c;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10988b;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109893;
  std::ostream::flush();
  alStack_a80[6] = 0x1098a2;
  BigNum::BigNum(&local_a40.first,5);
  alStack_a80[6] = 0x1098b4;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1098e1;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1098f0;
  BigNum::BigNum(&local_a40.first,0xd);
  alStack_a80[6] = 0x109902;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109929;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10993e;
  BigNum::BigNum(&local_1c8,&local_940);
  alStack_a80[6] = 0x109953;
  BigNum::BigNum(&local_1e8,&local_980);
  alStack_a80[6] = 0x10996d;
  reverseByMod(&local_a40.first,&local_1c8,&local_1e8);
  alStack_a80[6] = 0x10997f;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1099a7;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1099c4;
    operator_delete(local_1e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x1099e1;
    operator_delete(local_1c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x1099f6;
  BigNum::BigNum(&local_208,&local_940);
  alStack_a80[6] = 0x109a03;
  print(&local_208);
  if (local_208.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109a20;
    operator_delete(local_208.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109a38;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"^(-1) (mod ",0xb);
  alStack_a80[6] = 0x109a4d;
  BigNum::BigNum(&local_228,&local_980);
  alStack_a80[6] = 0x109a5a;
  print(&local_228);
  if (local_228.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109a77;
    operator_delete(local_228.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109a92;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") = ",4);
  alStack_a80[6] = 0x109aa7;
  BigNum::BigNum(&local_248,&local_960);
  alStack_a80[6] = 0x109ab4;
  print(&local_248);
  if (local_248.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109ad1;
    operator_delete(local_248.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109ae5;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x109af4;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109afc;
  std::ostream::flush();
  alStack_a80[6] = 0x109b0b;
  BigNum::BigNum(&local_a40.first,5);
  alStack_a80[6] = 0x109b1d;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109b4b;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109b5a;
  BigNum::BigNum(&local_a40.first,7);
  alStack_a80[6] = 0x109b6c;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109b93;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109ba8;
  BigNum::BigNum(&local_268,&local_940);
  alStack_a80[6] = 0x109bbd;
  BigNum::BigNum(&local_288,&local_980);
  alStack_a80[6] = 0x109bd7;
  reverseByMod(&local_a40.first,&local_268,&local_288);
  alStack_a80[6] = 0x109be9;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109c11;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109c2e;
    operator_delete(local_288.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_268.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109c4b;
    operator_delete(local_268.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109c60;
  BigNum::BigNum(&local_2a8,&local_940);
  alStack_a80[6] = 0x109c6d;
  print(&local_2a8);
  if (local_2a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109c8a;
    operator_delete(local_2a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109ca2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"^(-1) (mod ",0xb);
  alStack_a80[6] = 0x109cb7;
  BigNum::BigNum(&local_2c8,&local_980);
  alStack_a80[6] = 0x109cc4;
  print(&local_2c8);
  if (local_2c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109ce1;
    operator_delete(local_2c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109cfc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") = ",4);
  alStack_a80[6] = 0x109d11;
  BigNum::BigNum(&local_2e8,&local_960);
  alStack_a80[6] = 0x109d1e;
  print(&local_2e8);
  if (local_2e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109d3b;
    operator_delete(local_2e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109d4f;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x109d5e;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109d66;
  std::ostream::flush();
  alStack_a80[6] = 0x109d75;
  BigNum::BigNum(&local_a40.first,0x47);
  alStack_a80[6] = 0x109d87;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109dad;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109dbc;
  BigNum::BigNum(&local_a40.first,0x5b);
  alStack_a80[6] = 0x109dce;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109df5;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109e0a;
  BigNum::BigNum(&local_308,&local_940);
  alStack_a80[6] = 0x109e1f;
  BigNum::BigNum(&local_328,&local_980);
  alStack_a80[6] = 0x109e39;
  reverseByMod(&local_a40.first,&local_308,&local_328);
  alStack_a80[6] = 0x109e4b;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109e73;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_328.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109e90;
    operator_delete(local_328.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109ead;
    operator_delete(local_308.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109ec2;
  BigNum::BigNum(&local_348,&local_940);
  alStack_a80[6] = 0x109ecf;
  print(&local_348);
  if (local_348.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109eec;
    operator_delete(local_348.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109f04;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"^(-1) (mod ",0xb);
  alStack_a80[6] = 0x109f19;
  BigNum::BigNum(&local_368,&local_980);
  alStack_a80[6] = 0x109f26;
  print(&local_368);
  if (local_368.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109f43;
    operator_delete(local_368.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_368.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_368.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109f5e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") = ",4);
  alStack_a80[6] = 0x109f73;
  BigNum::BigNum(&local_388,&local_960);
  alStack_a80[6] = 0x109f80;
  print(&local_388);
  if (local_388.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x109f9d;
    operator_delete(local_388.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_388.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x109fb1;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x109fc0;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x109fc8;
  std::ostream::flush();
  alStack_a80[6] = 0x109fef;
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"12","");
  alStack_a80[6] = 0x10a001;
  BigNum::BigNum(&local_a40.first,&local_740);
  alStack_a80[6] = 0x10a013;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a039;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    alStack_a80[6] = 0x10a056;
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a07d;
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"6","");
  alStack_a80[6] = 0x10a08f;
  BigNum::BigNum(&local_a40.first,&local_760);
  alStack_a80[6] = 0x10a0a1;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a0c8;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    alStack_a80[6] = 0x10a0e5;
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a0fa;
  BigNum::BigNum(&local_3a8,&local_940);
  alStack_a80[6] = 0x10a10f;
  BigNum::BigNum(&local_3c8,&local_980);
  alStack_a80[6] = 0x10a129;
  operator/(&local_a40.first,&local_3a8,&local_3c8);
  alStack_a80[6] = 0x10a13b;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a163;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a180;
    operator_delete(local_3c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a19d;
    operator_delete(local_3a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a1b2;
  BigNum::BigNum(&local_3e8,&local_940);
  alStack_a80[6] = 0x10a1bf;
  print(&local_3e8);
  if (local_3e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a1dc;
    operator_delete(local_3e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a1f4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," / ",3);
  alStack_a80[6] = 0x10a209;
  BigNum::BigNum(&local_408,&local_980);
  alStack_a80[6] = 0x10a216;
  print(&local_408);
  if (local_408.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a233;
    operator_delete(local_408.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a24e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10a263;
  BigNum::BigNum(&local_428,&local_960);
  alStack_a80[6] = 0x10a270;
  print(&local_428);
  if (local_428.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a28d;
    operator_delete(local_428.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_428.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a2a1;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10a2b0;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10a2b8;
  std::ostream::flush();
  alStack_a80[6] = 0x10a2df;
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"3","");
  alStack_a80[6] = 0x10a2f1;
  BigNum::BigNum(&local_a40.first,&local_780);
  alStack_a80[6] = 0x10a303;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a329;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    alStack_a80[6] = 0x10a346;
    operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a36d;
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"9","");
  alStack_a80[6] = 0x10a37f;
  BigNum::BigNum(&local_a40.first,&local_7a0);
  alStack_a80[6] = 0x10a391;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a3b8;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    alStack_a80[6] = 0x10a3d5;
    operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a3ea;
  BigNum::BigNum(&local_448,&local_940);
  alStack_a80[6] = 0x10a3ff;
  BigNum::BigNum(&local_468,&local_980);
  alStack_a80[6] = 0x10a419;
  pow(__x_00,in_XMM1_Qa);
  alStack_a80[6] = 0x10a42b;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a453;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a470;
    operator_delete(local_468.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_468.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_448.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a48d;
    operator_delete(local_448.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_448.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a4a2;
  BigNum::BigNum(&local_488,&local_940);
  alStack_a80[6] = 0x10a4af;
  print(&local_488);
  if (local_488.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a4cc;
    operator_delete(local_488.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_488.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a4e4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"^",1);
  alStack_a80[6] = 0x10a4f9;
  BigNum::BigNum(&local_4a8,&local_980);
  alStack_a80[6] = 0x10a506;
  print(&local_4a8);
  if (local_4a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a523;
    operator_delete(local_4a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a53e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10a553;
  BigNum::BigNum(&local_4c8,&local_960);
  alStack_a80[6] = 0x10a560;
  print(&local_4c8);
  if (local_4c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a57d;
    operator_delete(local_4c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a591;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10a5a0;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10a5a8;
  std::ostream::flush();
  alStack_a80[6] = 0x10a5cf;
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"400","");
  alStack_a80[6] = 0x10a5e1;
  BigNum::BigNum(&local_a40.first,&local_7c0);
  alStack_a80[6] = 0x10a5f3;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a619;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    alStack_a80[6] = 0x10a636;
    operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a65d;
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"9","");
  alStack_a80[6] = 0x10a66f;
  BigNum::BigNum(&local_a40.first,&local_7e0);
  alStack_a80[6] = 0x10a681;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a6a8;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    alStack_a80[6] = 0x10a6c5;
    operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a6da;
  BigNum::BigNum(&local_4e8,&local_940);
  alStack_a80[6] = 0x10a6ef;
  BigNum::BigNum(&local_508,&local_980);
  alStack_a80[6] = 0x10a709;
  operator+(&local_a40.first,&local_4e8,&local_508);
  alStack_a80[6] = 0x10a71b;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a743;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_508.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a760;
    operator_delete(local_508.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_508.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_508.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_4e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a77d;
    operator_delete(local_4e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a792;
  BigNum::BigNum(&local_528,&local_940);
  alStack_a80[6] = 0x10a79f;
  print(&local_528);
  if (local_528.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a7bc;
    operator_delete(local_528.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_528.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_528.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a7d4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," + ",3);
  alStack_a80[6] = 0x10a7e9;
  BigNum::BigNum(&local_548,&local_980);
  alStack_a80[6] = 0x10a7f6;
  print(&local_548);
  if (local_548.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a813;
    operator_delete(local_548.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_548.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a82e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10a843;
  BigNum::BigNum(&local_568,&local_960);
  alStack_a80[6] = 0x10a850;
  print(&local_568);
  if (local_568.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a86d;
    operator_delete(local_568.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_568.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_568.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10a881;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10a890;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10a898;
  std::ostream::flush();
  alStack_a80[6] = 0x10a8bf;
  local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"64","");
  alStack_a80[6] = 0x10a8d1;
  BigNum::BigNum(&local_a40.first,&local_800);
  alStack_a80[6] = 0x10a8e3;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a909;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800._M_dataplus._M_p != &local_800.field_2) {
    alStack_a80[6] = 0x10a926;
    operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a94d;
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_820,"64","");
  alStack_a80[6] = 0x10a95f;
  BigNum::BigNum(&local_a40.first,&local_820);
  alStack_a80[6] = 0x10a971;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10a998;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    alStack_a80[6] = 0x10a9b5;
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10a9ca;
  BigNum::BigNum(&local_588,&local_940);
  alStack_a80[6] = 0x10a9df;
  BigNum::BigNum(&local_5a8,&local_980);
  alStack_a80[6] = 0x10a9f9;
  operator*(&local_a40.first,&local_588,&local_5a8);
  alStack_a80[6] = 0x10aa0b;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10aa33;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10aa50;
    operator_delete(local_5a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_588.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10aa6d;
    operator_delete(local_588.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_588.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10aa82;
  BigNum::BigNum(&local_5c8,&local_940);
  alStack_a80[6] = 0x10aa8f;
  print(&local_5c8);
  if (local_5c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10aaac;
    operator_delete(local_5c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5c8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10aac4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," * ",3);
  alStack_a80[6] = 0x10aad9;
  BigNum::BigNum(&local_5e8,&local_980);
  alStack_a80[6] = 0x10aae6;
  print(&local_5e8);
  if (local_5e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ab03;
    operator_delete(local_5e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5e8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10ab1e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10ab33;
  BigNum::BigNum(&local_608,&local_960);
  alStack_a80[6] = 0x10ab40;
  print(&local_608);
  if (local_608.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ab5d;
    operator_delete(local_608.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_608.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_608.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10ab71;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10ab80;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10ab88;
  std::ostream::flush();
  alStack_a80[6] = 0x10abaf;
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"4096","");
  alStack_a80[6] = 0x10abc1;
  BigNum::BigNum(&local_a40.first,&local_840);
  alStack_a80[6] = 0x10abd3;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_940.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_940.sign = local_a40.first.sign;
  local_940.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10abf9;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    alStack_a80[6] = 0x10ac16;
    operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10ac3d;
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"4","");
  alStack_a80[6] = 0x10ac4f;
  BigNum::BigNum(&local_a40.first,&local_860);
  alStack_a80[6] = 0x10ac61;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_980.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_980.sign = local_a40.first.sign;
  local_980.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ac88;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    alStack_a80[6] = 0x10aca5;
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  alStack_a80[6] = 0x10acba;
  BigNum::BigNum(&local_628,&local_940);
  alStack_a80[6] = 0x10accf;
  BigNum::BigNum(&local_648,&local_980);
  alStack_a80[6] = 0x10ace9;
  operator/(&local_a40.first,&local_628,&local_648);
  alStack_a80[6] = 0x10acfb;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_960.digits,(vector<int,_std::allocator<int>_> *)&local_a40);
  local_960.sign = local_a40.first.sign;
  local_960.length = local_a40.first.length;
  if (local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ad23;
    operator_delete(local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a40.first.digits.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_648.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ad40;
    operator_delete(local_648.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_648.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_648.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_628.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ad5d;
    operator_delete(local_628.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_628.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_628.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10ad72;
  BigNum::BigNum(&local_668,&local_940);
  alStack_a80[6] = 0x10ad7f;
  print(&local_668);
  if (local_668.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ad9c;
    operator_delete(local_668.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_668.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_668.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10adb4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," / ",3);
  alStack_a80[6] = 0x10adc9;
  BigNum::BigNum(&local_688,&local_980);
  alStack_a80[6] = 0x10add6;
  print(&local_688);
  if (local_688.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10adf3;
    operator_delete(local_688.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_688.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_688.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10ae0e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  alStack_a80[6] = 0x10ae23;
  BigNum::BigNum(&local_6a8,&local_960);
  alStack_a80[6] = 0x10ae30;
  print(&local_6a8);
  if (local_6a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10ae4d;
    operator_delete(local_6a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6a8.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  alStack_a80[6] = 0x10ae61;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  alStack_a80[6] = 0x10ae70;
  std::ostream::put(-0x70);
  alStack_a80[6] = 0x10ae78;
  std::ostream::flush();
  alStack_a80[6] = 0x10ae85;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_8a0);
  alStack_a80[6] = 0x10ae92;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            ((vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_> *)
             &local_880);
  alStack_a80[6] = 0x10ae9f;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_6c0);
  alStack_a80[6] = 0x10aeac;
  std::vector<std::pair<BigNum,_BigNum>,_std::allocator<std::pair<BigNum,_BigNum>_>_>::~vector
            (&local_48);
  if (local_960.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10aec9;
    operator_delete(local_960.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_960.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_960.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_980.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10aee6;
    operator_delete(local_980.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_980.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_980.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_940.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    alStack_a80[6] = 0x10af03;
    operator_delete(local_940.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_940.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_940.digits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    BigNum a = BigNum("6");
    BigNum b = BigNum("2");
    BigNum c = BigNum("1234567827483828383893828238989938389893389");

   // a = BigNum("4096");
    b = BigNum("123456798960569059");
    c =  sqrt(b);
   // print(a);
    cout << " sqrt ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    // solve_system(vector<std::pair<BigNum, BigNum>> equations)

    vector<std::pair<BigNum, BigNum>> test = {{BigNum(2), BigNum(5)},
                                              {BigNum(3), BigNum(7)},
                                              {BigNum(5), BigNum(11)}};
    c = solve_system(test);
    cout << "Result: ";
    print(c);
    cout << endl;

    vector<std::pair<BigNum, BigNum>> test4 = {{BigNum(5), BigNum(9)},
                                              {BigNum(7), BigNum(8)},
                                              {BigNum(3), BigNum(7)}};
    c = solve_system(test4);
    cout << "Result: ";
    print(c);
    cout << endl;
    vector<std::pair<BigNum, BigNum>> test1 = {{BigNum(1), BigNum(5)},
                                              {BigNum(2), BigNum(7)}};
    c = solve_system(test1);
    cout << "Result: ";
    print(c);
    cout << endl;

    vector<std::pair<BigNum, BigNum>> test2 = {{BigNum(0), BigNum(2)},
                                               {BigNum(0), BigNum(4)}};
    c = solve_system(test2);
    cout << "Result: ";
    print(c);
    cout << endl;

    a = BigNum(5);
    b = BigNum(13);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;

    a = BigNum(5);
    b = BigNum(7);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;

    a = BigNum(71);
    b = BigNum(91);
    c = reverseByMod(a, b);
    print(a);
    cout << "^(-1) (mod ";
    print(b);
    cout << ") = ";
    print(c);
    cout << endl;


    a = BigNum("12");
    b = BigNum("6");
    int f = 10;
    c = a / b;
    print(a);
    cout << " / ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("3");
    b = BigNum("9");
    c = pow(a,b);
    print(a);
    cout << "^";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("400");
    b = BigNum("9");
    c = a + b;
    print(a);
    cout << " + ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;


    a = BigNum("64");
    b = BigNum("64");
    c = a * b;
    print(a);
    cout << " * ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;

    a = BigNum("4096");
    b = BigNum("4");
    c = a / b;
    print(a);
    cout << " / ";
    print(b);
    cout << " = ";
    print(c);
    cout << endl;


    return 0;
}